

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nhdp_db.c
# Opt level: O0

void nhdp_db_link_update_status(nhdp_link *lnk)

{
  nhdp_link_status nVar1;
  nhdp_link_status nVar2;
  uint64_t uVar3;
  bool bVar4;
  _Bool was_symmetric;
  nhdp_link_status old_status;
  nhdp_link *lnk_local;
  
  nVar1 = lnk->status;
  bVar4 = lnk->status == NHDP_LINK_SYMMETRIC;
  lnk->last_status = lnk->status;
  nVar2 = _nhdp_db_link_calculate_status(lnk);
  lnk->status = nVar2;
  if ((bVar4) && (lnk->status != NHDP_LINK_SYMMETRIC)) {
    _link_status_not_symmetric_anymore(lnk);
  }
  if ((!bVar4) && (lnk->status == NHDP_LINK_SYMMETRIC)) {
    _link_status_now_symmetric(lnk);
  }
  if (bVar4 != (lnk->status == NHDP_LINK_SYMMETRIC)) {
    nhdp_interface_update_status(lnk->local_if);
  }
  if (nVar1 != lnk->status) {
    uVar3 = oonf_clock_getNow();
    lnk->last_status_change = uVar3;
    nhdp_domain_recalculate_metrics((nhdp_domain *)0x0,lnk->neigh);
    nhdp_domain_delayed_mpr_recalculation((nhdp_domain *)0x0,lnk->neigh);
    oonf_class_event(&_link_info,lnk,OONF_OBJECT_CHANGED);
  }
  return;
}

Assistant:

void
nhdp_db_link_update_status(struct nhdp_link *lnk) {
  enum nhdp_link_status old_status;
  bool was_symmetric;

  old_status = lnk->status;
  was_symmetric = lnk->status == NHDP_LINK_SYMMETRIC;

  /* update link status */
  lnk->last_status = lnk->status;
  lnk->status = _nhdp_db_link_calculate_status(lnk);

  /* handle database changes */
  if (was_symmetric && lnk->status != NHDP_LINK_SYMMETRIC) {
    _link_status_not_symmetric_anymore(lnk);
  }
  if (!was_symmetric && lnk->status == NHDP_LINK_SYMMETRIC) {
    _link_status_now_symmetric(lnk);
  }

  /* trigger ip flooding interface settings recalculation */
  if (was_symmetric != (lnk->status == NHDP_LINK_SYMMETRIC)) {
    nhdp_interface_update_status(lnk->local_if);
  }

  if (old_status != lnk->status) {
    /* link status was changed */
    lnk->last_status_change = oonf_clock_getNow();
    nhdp_domain_recalculate_metrics(NULL, lnk->neigh);
    nhdp_domain_delayed_mpr_recalculation(NULL, lnk->neigh);

    /* trigger change event */
    oonf_class_event(&_link_info, lnk, OONF_OBJECT_CHANGED);
  }
}